

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadPrimAttrIdentifier(AsciiParser *this,string *token)

{
  int *piVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  uint8_t uVar4;
  char cVar5;
  undefined8 uVar6;
  bool bVar7;
  int iVar8;
  ostream *poVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  long lVar11;
  StreamReader *pSVar12;
  ulong uVar13;
  char *pcVar14;
  char *pcVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  string tok;
  ostringstream ss_e;
  stringstream ss;
  undefined1 local_3b8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  string local_378;
  string *local_358;
  undefined1 local_350 [112];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  _Alloc_hider local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0;
  _Alloc_hider local_2b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0 [12];
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_358 = token;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  pSVar12 = this->_sr;
  uVar13 = pSVar12->idx_;
  if (uVar13 < pSVar12->length_) {
    while( true ) {
      uVar4 = pSVar12->binary_[uVar13];
      if (uVar4 == '\0') break;
      pSVar12->idx_ = uVar13 + 1;
      if (uVar4 == '.') {
        ::std::__cxx11::stringbuf::str();
        uVar6 = local_350._8_8_;
        if ((undefined1 *)local_350._0_8_ != local_350 + 0x10) {
          operator_delete((void *)local_350._0_8_,local_350._16_8_ + 1);
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar6 ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_350);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_350,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_350,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_350,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_350,"ReadPrimAttrIdentifier",0x16);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_350,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<((ostringstream *)local_350,0x605);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          pcVar15 = "PrimAttr name must not starts with `.`";
LAB_00322a60:
          lVar11 = 0x26;
LAB_00322a65:
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_350,pcVar15,lVar11);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_350,"\n",1);
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)local_3b8);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b8._0_8_
              == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_3b8 + 0x10)) goto LAB_003222f9;
          goto LAB_003222ec;
        }
      }
      else if (uVar4 != '_') {
        if (uVar4 == ':') {
          ::std::__cxx11::stringbuf::str();
          uVar6 = local_350._8_8_;
          if ((undefined1 *)local_350._0_8_ != local_350 + 0x10) {
            operator_delete((void *)local_350._0_8_,local_350._16_8_ + 1);
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar6 ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_350);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_350,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_350,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_350,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_350,"ReadPrimAttrIdentifier",0x16);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_350,"():",3);
            poVar9 = (ostream *)::std::ostream::operator<<((ostringstream *)local_350,0x600);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
            pcVar15 = "PrimAttr name must not starts with `:`";
            goto LAB_00322a60;
          }
        }
        else {
          iVar8 = isalnum((int)(char)uVar4);
          if (iVar8 == 0) {
            if ((uVar13 < 0x7fffffffffffffff) && (uVar13 <= pSVar12->length_)) {
              pSVar12->idx_ = uVar13;
            }
            break;
          }
          ::std::__cxx11::stringbuf::str();
          uVar6 = local_350._8_8_;
          if ((undefined1 *)local_350._0_8_ != local_350 + 0x10) {
            operator_delete((void *)local_350._0_8_,local_350._16_8_ + 1);
          }
          if (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar6 ==
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
             (iVar8 = isalpha((int)(char)uVar4), iVar8 == 0)) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_350);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_350,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_350,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_350,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_350,"ReadPrimAttrIdentifier",0x16);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_350,"():",3);
            poVar9 = (ostream *)::std::ostream::operator<<((ostringstream *)local_350,0x60b);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
            pcVar15 = "PrimAttr name must not starts with number.";
            lVar11 = 0x2a;
            goto LAB_00322a65;
          }
        }
      }
      piVar1 = &(this->_curr_cursor).col;
      *piVar1 = *piVar1 + 1;
      local_350[0] = uVar4;
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_350,1);
      pSVar12 = this->_sr;
      uVar13 = pSVar12->idx_;
      if (pSVar12->length_ <= uVar13) break;
    }
  }
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_3b8 + 0x10);
  local_3b8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_3b8[0x10] = '\0';
  local_398._M_allocated_capacity = (size_type)&local_388;
  local_3b8._0_8_ = pbVar2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"");
  ::std::__cxx11::stringbuf::str();
  Path::Path((Path *)local_350,(string *)&local_398,&local_378);
  bVar7 = pathutil::ValidatePropPath((Path *)local_350,(string *)local_3b8);
  if (local_2b0._M_p != local_350 + 0xb0) {
    operator_delete(local_2b0._M_p,local_2a0[0]._M_allocated_capacity + 1);
  }
  if (local_2d0._M_p != local_350 + 0x90) {
    operator_delete(local_2d0._M_p,local_2c0._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_350._96_8_ != local_350 + 0x70) {
    operator_delete((void *)local_350._96_8_,local_2e0._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_350._64_8_ != local_350 + 0x50) {
    operator_delete((void *)local_350._64_8_,local_350._80_8_ + 1);
  }
  if ((undefined1 *)local_350._32_8_ != local_350 + 0x30) {
    operator_delete((void *)local_350._32_8_,local_350._48_8_ + 1);
  }
  if ((undefined1 *)local_350._0_8_ != local_350 + 0x10) {
    operator_delete((void *)local_350._0_8_,local_350._16_8_ + 1);
  }
  paVar3 = &local_378.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_dataplus._M_p != paVar3) {
    operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._M_allocated_capacity != &local_388) {
    operator_delete((void *)local_398._M_allocated_capacity,local_388._M_allocated_capacity + 1);
  }
  if (bVar7) {
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b8._0_8_ !=
        pbVar2) {
      operator_delete((void *)local_3b8._0_8_,CONCAT71(local_3b8._17_7_,local_3b8[0x10]) + 1);
    }
    ::std::__cxx11::stringbuf::str();
    cVar5 = ((pointer)(local_350._0_8_ + -1))[local_350._8_8_];
    if ((undefined1 *)local_350._0_8_ != local_350 + 0x10) {
      operator_delete((void *)local_350._0_8_,local_350._16_8_ + 1);
    }
    if (cVar5 != '.') {
      ::std::__cxx11::stringbuf::str();
      lVar11 = ::std::__cxx11::string::find((char)local_3b8,0x2e);
      if (lVar11 == -1) {
LAB_00322719:
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::operator=((string *)local_358,(string *)local_350);
        if ((undefined1 *)local_350._0_8_ != local_350 + 0x10) {
          operator_delete((void *)local_350._0_8_,local_350._16_8_ + 1);
        }
        bVar7 = true;
      }
      else {
        local_350._0_8_ = local_350 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_350,".connect","");
        if ((ulong)local_3b8._8_8_ < (ulong)local_350._8_8_) {
LAB_0032259b:
          local_398._M_allocated_capacity = (size_type)&local_388;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,".timeSamples","");
          pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_398._8_8_;
          if ((ulong)local_3b8._8_8_ < (ulong)local_398._8_8_) {
            bVar7 = false;
          }
          else {
            lVar11 = ::std::__cxx11::string::find
                               (local_3b8,local_398._M_allocated_capacity,
                                local_3b8._8_8_ - local_398._8_8_);
            bVar7 = lVar11 != -1;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_398._M_allocated_capacity != &local_388) {
            operator_delete((void *)local_398._M_allocated_capacity,
                            local_388._M_allocated_capacity + 1);
          }
        }
        else {
          lVar11 = ::std::__cxx11::string::find
                             (local_3b8,local_350._0_8_,local_3b8._8_8_ - local_350._8_8_);
          bVar7 = true;
          pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_350._8_8_;
          if (lVar11 == -1) goto LAB_0032259b;
        }
        if ((undefined1 *)local_350._0_8_ != local_350 + 0x10) {
          operator_delete((void *)local_350._0_8_,local_350._16_8_ + 1);
        }
        if (bVar7) {
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b8._8_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            uVar13 = 0;
            do {
              uVar13 = uVar13 + (*(char *)(local_3b8._0_8_ + (long)pbVar10) == '.');
              pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&(pbVar10->_M_dataplus)._M_p + 1);
            } while ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_3b8._8_8_ != pbVar10);
            if (1 < uVar13) {
              pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_3b8._0_8_;
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_350);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_350,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_350,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                         ,0x56);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_350,"[ASCII]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_350,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_350,"ReadPrimAttrIdentifier",0x16);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_350,"():",3);
              poVar9 = (ostream *)::std::ostream::operator<<((ostringstream *)local_350,0x638);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
              pcVar14 = "Attribute identifier `{}` containing multiple `.` is not allowed.";
              pcVar15 = "";
              goto LAB_00322819;
            }
          }
          goto LAB_00322719;
        }
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_350);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_350,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_350,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_350,"[ASCII]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_350,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_350,"ReadPrimAttrIdentifier",0x16);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_350,"():",3);
        poVar9 = (ostream *)::std::ostream::operator<<((ostringstream *)local_350,0x630);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        pcVar14 = "Must ends with `.connect` or `.timeSamples` for attrbute name: `{}`";
        pcVar15 = "";
LAB_00322819:
        local_378._M_dataplus._M_p = (pointer)paVar3;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,pcVar14,pcVar15);
        fmt::format<std::__cxx11::string>
                  ((string *)&local_398,(fmt *)&local_378,(string *)local_3b8,pbVar10);
        poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_350,(char *)local_398._M_allocated_capacity,
                            local_398._8_8_);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398._M_allocated_capacity != &local_388) {
          operator_delete((void *)local_398._M_allocated_capacity,
                          local_388._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_378._M_dataplus._M_p != paVar3) {
          operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
        }
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)&local_398);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398._M_allocated_capacity != &local_388) {
          operator_delete((void *)local_398._M_allocated_capacity,
                          local_388._M_allocated_capacity + 1);
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_350);
        ::std::ios_base::~ios_base((ios_base *)(local_350 + 0x70));
        bVar7 = false;
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b8._0_8_ !=
          pbVar2) {
        operator_delete((void *)local_3b8._0_8_,CONCAT71(local_3b8._17_7_,local_3b8[0x10]) + 1);
      }
      goto LAB_003224f2;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_350);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_350,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_350,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_350,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_350,"ReadPrimAttrIdentifier",0x16);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_350,"():",3);
    poVar9 = (ostream *)::std::ostream::operator<<((ostringstream *)local_350,0x623);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_350,"PrimAttr name must not ends with `.`\n",0x25);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_350,"\n",1);
    ::std::__cxx11::stringbuf::str();
    PushError(this,(string *)local_3b8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b8._0_8_ !=
        pbVar2) {
LAB_003222ec:
      operator_delete((void *)local_3b8._0_8_,CONCAT71(local_3b8._17_7_,local_3b8[0x10]) + 1);
    }
LAB_003222f9:
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_350);
    ::std::ios_base::~ios_base((ios_base *)(local_350 + 0x70));
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_350);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_350,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_350,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_350,"[ASCII]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_350,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_350,"ReadPrimAttrIdentifier",0x16);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_350,"():",3);
    poVar9 = (ostream *)::std::ostream::operator<<((ostringstream *)local_350,0x61d);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
    local_378._M_dataplus._M_p = (pointer)paVar3;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_378,"Invalid Property name `{}`: {}","");
    ::std::__cxx11::stringbuf::str();
    fmt::format<std::__cxx11::string,std::__cxx11::string>
              ((string *)&local_398,(fmt *)&local_378,&local_1d8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b8,in_R8)
    ;
    poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_350,(char *)local_398._M_allocated_capacity,local_398._8_8_
                       );
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_allocated_capacity != &local_388) {
      operator_delete((void *)local_398._M_allocated_capacity,local_388._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_dataplus._M_p != paVar3) {
      operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
    }
    ::std::__cxx11::stringbuf::str();
    PushError(this,(string *)&local_398);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_allocated_capacity != &local_388) {
      operator_delete((void *)local_398._M_allocated_capacity,local_388._M_allocated_capacity + 1);
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_350);
    ::std::ios_base::~ios_base((ios_base *)(local_350 + 0x70));
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b8._0_8_ !=
        pbVar2) {
      operator_delete((void *)local_3b8._0_8_,CONCAT71(local_3b8._17_7_,local_3b8[0x10]) + 1);
    }
  }
  bVar7 = false;
LAB_003224f2:
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return bVar7;
}

Assistant:

bool AsciiParser::ReadPrimAttrIdentifier(std::string *token) {
  // Example:
  // - xformOp:transform
  // - primvars:uvmap1

  std::stringstream ss;

  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      // this should not happen.
      return false;
    }

    if (c == '_') {
      // ok
    } else if (c == ':') {  // namespace
      // ':' must lie in the middle of string literal
      if (ss.str().size() == 0) {
        PUSH_ERROR_AND_RETURN("PrimAttr name must not starts with `:`");
      }
    } else if (c == '.') {  // delimiter for `connect`
      // '.' must lie in the middle of string literal
      if (ss.str().size() == 0) {
        PUSH_ERROR_AND_RETURN("PrimAttr name must not starts with `.`");
      }
    } else if (std::isalnum(int(c))) {
      // number must not be allowed for the first char.
      if (ss.str().size() == 0) {
        if (!std::isalpha(int(c))) {
          PUSH_ERROR_AND_RETURN("PrimAttr name must not starts with number.");
        }
      }
    } else {
      _sr->seek_from_current(-1);
      break;
    }

    _curr_cursor.col++;

    ss << c;
  }

  {
    std::string name_err;
    if (!pathutil::ValidatePropPath(Path("", ss.str()), &name_err)) {
      PUSH_ERROR_AND_RETURN_TAG(
          kAscii,
          fmt::format("Invalid Property name `{}`: {}", ss.str(), name_err));
    }
  }

  // '.' must lie in the middle of string literal
  if (ss.str().back() == '.') {
    PUSH_ERROR_AND_RETURN("PrimAttr name must not ends with `.`\n");
    return false;
  }

  std::string tok = ss.str();

  if (contains(tok, '.')) {
    if (endsWith(tok, ".connect") || endsWith(tok, ".timeSamples")) {
      // OK
    } else {
      PUSH_ERROR_AND_RETURN_TAG(
          kAscii, fmt::format("Must ends with `.connect` or `.timeSamples` for "
                              "attrbute name: `{}`",
                              tok));
    }

    // Multiple `.` is not allowed(e.g. attr.connect.timeSamples)
    if (counts(tok, '.') > 1) {
      PUSH_ERROR_AND_RETURN_TAG(
          kAscii, fmt::format("Attribute identifier `{}` containing multiple "
                              "`.` is not allowed.",
                              tok));
    }
  }

  (*token) = ss.str();
  DCOUT("primAttr identifier = " << (*token));
  return true;
}